

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O3

XXH_INLINE_XXH128_hash_t XXH_INLINE_XXH128(void *input,size_t len,XXH64_hash_t seed)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  XXH_INLINE_XXH128_hash_t XVar6;
  XXH_INLINE_XXH128_hash_t XVar7;
  ulong uVar8;
  xxh_u8 *in_RCX;
  xxh_u8 *secret;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  XXH_INLINE_XXH128_hash_t acc;
  XXH_INLINE_XXH128_hash_t acc_00;
  XXH_INLINE_XXH128_hash_t acc_01;
  XXH_INLINE_XXH128_hash_t acc_02;
  XXH_INLINE_XXH128_hash_t XVar21;
  XXH_INLINE_XXH128_hash_t acc_03;
  xxh_u8 local_f0 [192];
  undefined1 auVar15 [32];
  
  if (0x10 < len) {
    if (len < 0x81) {
      acc_03.low64 = len * -0x61c8864e7a143579;
      if (len < 0x21) {
        acc_02.high64 = 0;
        acc_02.low64 = acc_03.low64;
      }
      else {
        if (len < 0x41) {
          acc_01.high64 = 0;
          acc_01.low64 = acc_03.low64;
        }
        else {
          if (len < 0x61) {
            acc.high64 = 0;
            acc.low64 = acc_03.low64;
          }
          else {
            acc_03.high64 = 0;
            acc = XXH128_mix32B(acc_03,*(xxh_u8 **)((long)input + 0x30),
                                *(xxh_u8 **)((long)input + 0x38),
                                *(xxh_u8 **)((long)input + (len - 0x40)),
                                *(XXH64_hash_t *)((long)input + (len - 0x38)));
          }
          acc_01 = XXH128_mix32B(acc,*(xxh_u8 **)((long)input + 0x20),
                                 *(xxh_u8 **)((long)input + 0x28),
                                 *(xxh_u8 **)((long)input + (len - 0x30)),
                                 *(XXH64_hash_t *)((long)input + (len - 0x28)));
        }
        acc_02 = XXH128_mix32B(acc_01,*(xxh_u8 **)((long)input + 0x10),
                               *(xxh_u8 **)((long)input + 0x18),
                               *(xxh_u8 **)((long)input + (len - 0x20)),
                               *(XXH64_hash_t *)((long)input + (len - 0x18)));
      }
      XVar21 = XXH128_mix32B(acc_02,*input,*(xxh_u8 **)((long)input + 8),
                             *(xxh_u8 **)((long)input + (len - 0x10)),
                             *(XXH64_hash_t *)((long)input + (len - 8)));
      uVar11 = XVar21.low64 + XVar21.high64;
      uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      uVar8 = (len - seed) * -0x3d4d51c2d82b14b1 + XVar21.high64 * -0x7a1435883d4d519d +
              XVar21.low64 * -0x61c8864e7a143579;
      uVar11 = uVar11 >> 0x20 ^ uVar11;
      uVar8 = (uVar8 >> 0x25 ^ uVar8) * 0x165667919e3779f9;
      uVar8 = uVar8 >> 0x20 ^ uVar8;
    }
    else {
      if (0xf0 < len) {
        if (seed == 0) {
          secret = kSecret;
        }
        else {
          auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar18._8_8_ = 0xc;
          auVar18._0_8_ = 0xc;
          auVar18._16_8_ = 0xc;
          auVar18._24_8_ = 0xc;
          auVar19._8_8_ = 4;
          auVar19._0_8_ = 4;
          auVar19._16_8_ = 4;
          auVar19._24_8_ = 4;
          auVar14 = vpbroadcastq_avx512vl();
          lVar13 = 0xc;
          in_RCX = kSecret;
          do {
            uVar11 = vpcmpuq_avx512vl(auVar1,auVar18,1);
            uVar11 = uVar11 & 0xf;
            auVar20 = vpsllq_avx2(auVar1,4);
            auVar1 = vpaddq_avx2(auVar1,auVar19);
            lVar13 = lVar13 + -4;
            auVar15 = vpgatherqq_avx512vl(0xbe4ba423396cfeb8);
            auVar16._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar15._8_8_;
            auVar16._0_8_ = (ulong)((byte)uVar11 & 1) * auVar15._0_8_;
            auVar16._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar15._16_8_;
            auVar16._24_8_ = (uVar11 >> 3) * auVar15._24_8_;
            auVar15 = vpaddq_avx2(auVar16,auVar14);
            vpscatterqq_avx512vl(ZEXT832(local_f0) + auVar20,uVar11,auVar15);
            auVar15 = vpgatherqq_avx512vl(0x1cad21f72c81017c);
            auVar17._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar15._8_8_;
            auVar17._0_8_ = (ulong)((byte)uVar11 & 1) * auVar15._0_8_;
            auVar17._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar15._16_8_;
            auVar17._24_8_ = (uVar11 >> 3) * auVar15._24_8_;
            auVar15 = vpsubq_avx2(auVar17,auVar14);
            vpscatterqq_avx512vl(ZEXT832(local_f0) + ZEXT832(8) + auVar20,uVar11,auVar15);
          } while (lVar13 != 0);
          secret = local_f0;
        }
        XVar21 = XXH3_hashLong_128b_internal((xxh_u8 *)input,len,secret,(size_t)in_RCX);
        return XVar21;
      }
      lVar13 = 0;
      XVar21.high64 = 0;
      XVar21.low64 = len * -0x61c8864e7a143579;
      do {
        XVar21 = XXH128_mix32B(XVar21,*(xxh_u8 **)((long)input + lVar13),
                               *(xxh_u8 **)((long)input + lVar13 + 8),
                               *(xxh_u8 **)((long)input + lVar13 + 0x10),
                               *(XXH64_hash_t *)((long)input + lVar13 + 0x18));
        lVar13 = lVar13 + 0x20;
      } while (lVar13 != 0x80);
      uVar11 = (XVar21.low64 >> 0x25 ^ XVar21.low64) * 0x165667919e3779f9;
      uVar8 = (XVar21.high64 >> 0x25 ^ XVar21.high64) * 0x165667919e3779f9;
      acc_00.high64 = uVar8 >> 0x20 ^ uVar8;
      acc_00.low64 = uVar11 >> 0x20 ^ uVar11;
      if (0x9f < len) {
        uVar10 = (uint)(len >> 5) & 0x7ffffff;
        uVar9 = 5;
        if (5 < uVar10) {
          uVar9 = uVar10;
        }
        lVar13 = 0;
        do {
          acc_00 = XXH128_mix32B(acc_00,*(xxh_u8 **)((long)input + lVar13 + 0x80),
                                 *(xxh_u8 **)((long)input + lVar13 + 0x88),
                                 *(xxh_u8 **)((long)input + lVar13 + 0x90),
                                 *(XXH64_hash_t *)((long)input + lVar13 + 0x98));
          lVar13 = lVar13 + 0x20;
        } while ((ulong)(uVar9 << 5) - 0x80 != lVar13);
      }
      XVar21 = XXH128_mix32B(acc_00,*(xxh_u8 **)((long)input + (len - 0x10)),
                             *(xxh_u8 **)((long)input + (len - 8)),
                             *(xxh_u8 **)((long)input + (len - 0x20)),
                             *(XXH64_hash_t *)((long)input + (len - 0x18)));
      uVar11 = XVar21.low64 + XVar21.high64;
      uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      uVar8 = (len - seed) * -0x3d4d51c2d82b14b1 + XVar21.high64 * -0x7a1435883d4d519d +
              XVar21.low64 * -0x61c8864e7a143579;
      uVar11 = uVar11 >> 0x20 ^ uVar11;
      uVar8 = (uVar8 >> 0x25 ^ uVar8) * 0x165667919e3779f9;
      uVar8 = uVar8 >> 0x20 ^ uVar8;
    }
    XVar7.high64 = -uVar8;
    XVar7.low64 = uVar11;
    return XVar7;
  }
  if (len < 9) {
    if (3 < len) {
      uVar9 = (uint)seed;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = ((ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18) << 0x20 ^ seed) + 0xc4f023344dc994ac ^
                     CONCAT44(*(undefined4 *)((long)input + (len - 4)),*input);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = len * 4 + 0x9e3779b185ebca87;
      uVar8 = SUB168(auVar4 * auVar5,0);
      uVar11 = SUB168(auVar4 * auVar5,8) + uVar8 * 2;
      uVar8 = uVar11 >> 3 ^ uVar8;
      uVar8 = (uVar8 >> 0x23 ^ uVar8) * -0x604de39ae16720db;
      uVar8 = uVar8 >> 0x1c ^ uVar8;
      goto LAB_00109db4;
    }
    if (len == 0) {
      uVar11 = seed + 0x9e3779b185ebca87 ^ 0x682e908a3037f8b4;
      uVar8 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      uVar8 = uVar8 >> 0x20 ^ uVar8;
      uVar11 = 0xc2b2ae3d27d4eb4f - seed ^ 0x9655d30bd1a77d49;
      goto LAB_00109db4;
    }
    uVar9 = (int)len << 8;
    uVar10 = uVar9 | (uint)*input << 0x10 | (uint)*(byte *)((long)input + (len >> 1)) << 0x18;
    uVar12 = (uint)*(byte *)((long)input + (len - 1));
    uVar9 = uVar10 >> 0x18 | (uVar9 & 0xff0000 | (uint)*input << 0x10) >> 8 | (uVar9 & 0xff00) << 8;
    uVar8 = ((ulong)(uVar10 | uVar12) ^ seed + 0x87275a9b) * -0x61c8864e7a143579;
    uVar11 = ((ulong)((uVar9 | uVar12 << 0x18) >> 0x13 | uVar9 << 0xd) ^ 0x302c208b - seed) *
             0x27d4eb2f165667c5;
    uVar8 = uVar8 >> 0x25 ^ uVar8;
  }
  else {
    uVar11 = *(ulong *)((long)input + (len - 8));
    uVar8 = seed + 0xc202797692d63d58 ^ uVar11;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = 0x59973f0033362349 - seed ^ *input ^ uVar11;
    uVar11 = (uVar8 & 0xffffffff) * 0x85ebca76 + uVar8 +
             SUB168(auVar2 * ZEXT816(0x9e3779b185ebca87),8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                    (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                    (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                    (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^
                   (len << 0x36) + -0x40000000000000 +
                   SUB168(auVar2 * ZEXT816(0x9e3779b185ebca87),0);
    uVar8 = SUB168(auVar3 * ZEXT816(0xc2b2ae3d27d4eb4f),0);
    uVar11 = uVar11 * -0x3d4d51c2d82b14b1 + SUB168(auVar3 * ZEXT816(0xc2b2ae3d27d4eb4f),8);
    uVar8 = uVar8 >> 0x25 ^ uVar8;
  }
  uVar8 = uVar8 * 0x165667919e3779f9 >> 0x20 ^ uVar8 * 0x165667919e3779f9;
LAB_00109db4:
  uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
  XVar6.high64 = uVar11 >> 0x20 ^ uVar11;
  XVar6.low64 = uVar8;
  return XVar6;
}

Assistant:

XXH_PUBLIC_API XXH128_hash_t
XXH128(const void* input, size_t len, XXH64_hash_t seed)
{
    return XXH3_128bits_withSeed(input, len, seed);
}